

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

void __thiscall Json::Value::swap(Value *this,Value *other)

{
  Comments *this_00;
  anon_struct_4_2_14fb5ae2_for_bits_ aVar1;
  ValueHolder VVar2;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  _Var3;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  _Var4;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  __ptr;
  _Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  __ptr_00;
  ptrdiff_t pVar5;
  
  aVar1 = this->bits_;
  this->bits_ = other->bits_;
  other->bits_ = aVar1;
  VVar2 = this->value_;
  this->value_ = other->value_;
  other->value_ = VVar2;
  this_00 = &other->comments_;
  _Var3._M_head_impl =
       (this->comments_).ptr_._M_t.
       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       .
       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
       ._M_head_impl;
  (this->comments_).ptr_._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl =
       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
        *)0x0;
  _Var4._M_head_impl =
       (other->comments_).ptr_._M_t.
       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       .
       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
       ._M_head_impl;
  (other->comments_).ptr_._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl =
       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
        *)0x0;
  __ptr._M_head_impl =
       (this->comments_).ptr_._M_t.
       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       .
       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
       ._M_head_impl;
  (this->comments_).ptr_._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl = _Var4._M_head_impl;
  if (__ptr._M_head_impl !=
      (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL> *
      )0x0) {
    std::
    default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>
    ::operator()((default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>
                  *)&this->comments_,__ptr._M_head_impl);
  }
  __ptr_00.
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl =
       (this_00->ptr_)._M_t.
       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
       .
       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ;
  (this_00->ptr_)._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
       = (_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          )_Var3._M_head_impl;
  if (__ptr_00.
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl !=
      (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL> *
      )0x0) {
    std::
    default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>
    ::operator()((default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>
                  *)this_00,
                 (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                  *)__ptr_00.
                    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                    ._M_head_impl);
  }
  pVar5 = this->start_;
  this->start_ = other->start_;
  other->start_ = pVar5;
  pVar5 = this->limit_;
  this->limit_ = other->limit_;
  other->limit_ = pVar5;
  return;
}

Assistant:

void Value::swap(Value& other) {
  swapPayload(other);
  std::swap(comments_, other.comments_);
  std::swap(start_, other.start_);
  std::swap(limit_, other.limit_);
}